

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>
  *this_00;
  FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar7;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar8;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar9;
  value_type vVar10;
  value_type vVar11;
  
  vVar10 = FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
           ::dx(&this->left_->fadexpr_,i);
  this_00 = &this->right_->fadexpr_;
  pFVar6 = (this_00->left_->fadexpr_).left_;
  dVar1 = (pFVar6->fadexpr_).left_.constant_;
  pFVar7 = (pFVar6->fadexpr_).right_;
  dVar2 = (pFVar7->fadexpr_).left_.constant_;
  dVar3 = ((pFVar7->fadexpr_).right_)->val_;
  dVar4 = ((this_00->left_->fadexpr_).right_)->val_;
  dVar5 = this_00->right_->val_;
  vVar11 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>
           ::dx(this_00,i);
  pFVar8 = (this->left_->fadexpr_).left_;
  pFVar9 = (this->left_->fadexpr_).right_;
  return vVar11 * ((pFVar9->fadexpr_).left_.constant_ + ((pFVar9->fadexpr_).right_)->val_) *
                  ((pFVar8->fadexpr_).left_.constant_ + ((pFVar8->fadexpr_).right_)->val_) +
         ((dVar1 - dVar2 * dVar3) + dVar4 + dVar5) * vVar10;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}